

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

uint64_t __thiscall
nivalis::Environment::addr_of(Environment *this,string *var_name,bool mode_explicit)

{
  bool bVar1;
  char *pcVar2;
  uint64_t uVar3;
  size_type sVar4;
  iterator this_00;
  iterator __k;
  pointer ppVar5;
  reference pvVar6;
  reference this_01;
  mapped_type *pmVar7;
  byte in_DL;
  string *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  uint64_t addr_1;
  iterator it;
  int64_t addr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  uint64_t local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  size_type local_60;
  string local_48 [32];
  uint64_t local_28;
  byte local_19;
  string *local_18;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar2 == '@') {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_18);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    uVar3 = atoll(pcVar2);
    std::__cxx11::string::~string(local_48);
    if (((long)uVar3 < 0) ||
       (local_28 = uVar3, sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
       sVar4 <= uVar3)) {
      local_88 = 0xffffffffffffffff;
    }
    else {
      local_88 = local_28;
    }
    return local_88;
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(in_stack_ffffffffffffff68,(key_type *)0x11f7c7);
  __k = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb0,(_Self *)&stack0xffffffffffffffa8);
  if (!bVar1) {
    if ((local_19 & 1) != 0) {
      return 0xffffffffffffffff;
    }
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_ffffffffffffff80);
    if (bVar1) {
      local_60 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
      std::numeric_limits<double>::quiet_NaN();
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff70,(value_type_conflict2 *)in_stack_ffffffffffffff68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff70);
    }
    else {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_ffffffffffffff70);
      local_60 = *pvVar6;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x11f89b);
    }
    this_01 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(in_RDI + 1),local_60);
    std::__cxx11::string::operator=((string *)this_01,local_18);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)this_00._M_node,(key_type *)__k._M_node);
    *pmVar7 = local_60;
    return local_60;
  }
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                         *)in_stack_ffffffffffffff70);
  return ppVar5->second;
}

Assistant:

uint64_t Environment::addr_of(const std::string& var_name, bool mode_explicit) {
    error_msg.clear();
    if (var_name[0] == '@') {
        // Address
        int64_t addr = std::atoll(var_name.substr(1).c_str());
        return (addr < 0 ||
                static_cast<size_t>(addr) >= vars.size()) ?
            -1 : static_cast<uint64_t>(addr);
    }
    auto it = vreg.find(var_name);
    if (it != vreg.end()) {
        return it->second;
    } else {
        if (mode_explicit) return -1;
        uint64_t addr;
        if (free_addrs.empty()) {
            addr = vars.size();
            vars.push_back(std::numeric_limits<double>::quiet_NaN());
            varname.emplace_back();
        } else {
            addr = free_addrs.back();
            free_addrs.pop_back();
        }
        varname[addr] = var_name;
        return vreg[var_name] = addr;
    }
}